

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O2

void __thiscall
tonk::HostnameResolverState::InitializeResolvedAddressList
          (HostnameResolverState *this,results_type *results)

{
  pointer paVar1;
  element_type *peVar2;
  pointer pbVar3;
  bool bVar4;
  uint uVar5;
  uint64_t y;
  byte bVar6;
  const_iterator __begin1;
  address local_68;
  const_iterator __end1;
  
  paVar1 = (this->ResolvedIPAddresses).
           super__Vector_base<asio::ip::address,_std::allocator<asio::ip::address>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->ResolvedIPAddresses).
      super__Vector_base<asio::ip::address,_std::allocator<asio::ip::address>_>._M_impl.
      super__Vector_impl_data._M_finish != paVar1) {
    (this->ResolvedIPAddresses).
    super__Vector_base<asio::ip::address,_std::allocator<asio::ip::address>_>._M_impl.
    super__Vector_impl_data._M_finish = paVar1;
  }
  peVar2 = (results->super_basic_resolver_iterator<asio::ip::tcp>).values_.
           super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::vector<asio::ip::address,_std::allocator<asio::ip::address>_>::reserve
            (&this->ResolvedIPAddresses,
             ((long)*(pointer *)
                     ((long)&(peVar2->
                             super__Vector_base<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
                             )._M_impl.super__Vector_impl_data + 8) -
             *(long *)&(peVar2->
                       super__Vector_base<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
                       )._M_impl.super__Vector_impl_data) / 0x60);
  asio::ip::basic_resolver_results<asio::ip::tcp>::begin(&__begin1,results);
  __end1.index_ = 0;
  __end1.values_.
  super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  __end1.values_.
  super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    bVar4 = asio::ip::operator!=(&__begin1,&__end1);
    if (!bVar4) break;
    pbVar3 = ((__begin1.values_.
               super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->
             super__Vector_base<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar4 = *(short *)&pbVar3[__begin1.index_].endpoint_.impl_.data_ != 2;
    if (bVar4) {
      local_68.ipv6_address_.addr_.__in6_u._0_8_ =
           *(undefined8 *)((long)&pbVar3[__begin1.index_].endpoint_.impl_.data_ + 8);
      local_68.ipv6_address_.addr_.__in6_u._8_8_ =
           *(undefined8 *)((long)&pbVar3[__begin1.index_].endpoint_.impl_.data_ + 0x10);
      local_68.ipv6_address_.scope_id_ =
           (unsigned_long)*(uint *)((long)&pbVar3[__begin1.index_].endpoint_.impl_.data_ + 0x18);
      local_68.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
    }
    else {
      local_68.ipv4_address_.addr_.s_addr =
           *(in4_addr_type *)((long)&pbVar3[__begin1.index_].endpoint_.impl_.data_ + 4);
      local_68.ipv6_address_.scope_id_ = 0;
      local_68.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      local_68.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    }
    local_68.type_ = (uint)bVar4;
    std::vector<asio::ip::address,_std::allocator<asio::ip::address>_>::
    emplace_back<asio::ip::address>(&this->ResolvedIPAddresses,&local_68);
    asio::ip::basic_resolver_iterator<asio::ip::tcp>::increment(&__begin1);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&__end1.values_.
              super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&__begin1.values_.
              super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  this->ConnectRequestsRemaining =
       (uint)((ulong)((long)(this->ResolvedIPAddresses).
                            super__Vector_base<asio::ip::address,_std::allocator<asio::ip::address>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->ResolvedIPAddresses).
                           super__Vector_base<asio::ip::address,_std::allocator<asio::ip::address>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5);
  local_68.type_ = ipv4;
  local_68.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
  local_68.ipv6_address_.addr_.__in6_u._0_8_ = 0;
  y = siamese::GetTimeUsec();
  siamese::PCGRandom::Seed((PCGRandom *)&local_68,y,0);
  uVar5 = local_68.ipv4_address_.addr_.s_addr >> 0xd ^ (uint)((ulong)local_68._0_8_ >> 0x1b);
  bVar6 = local_68.ipv4_address_.addr_.s_addr._3_1_ >> 3;
  this->ConnectAddrIndex = (uVar5 >> bVar6 | uVar5 << 0x20 - bVar6) % this->ConnectRequestsRemaining
  ;
  return;
}

Assistant:

void HostnameResolverState::InitializeResolvedAddressList(
    const asio::ip::tcp::resolver::results_type& results)
{
    // Copy the resolved addresses
    ResolvedIPAddresses.clear();
    ResolvedIPAddresses.reserve(results.size());
    for (const auto& result : results) {
        ResolvedIPAddresses.emplace_back(result.endpoint().address());
    }
    ConnectRequestsRemaining = (unsigned)ResolvedIPAddresses.size();

    // Select the first address to connect to at random
    siamese::PCGRandom prng;
    prng.Seed(siamese::GetTimeUsec());
    ConnectAddrIndex = static_cast<int>(prng.Next() % ConnectRequestsRemaining);
}